

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O2

int count_rec(int v,int skip)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  size_type __n;
  reference rVar5;
  
  __n = (size_type)v;
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedcnt,__n);
  *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
  piVar1 = edge.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[__n].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = 1;
  for (piVar4 = edge.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[__n].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar4 != piVar1; piVar4 = piVar4 + 1) {
    iVar2 = *piVar4;
    if (iVar2 != skip) {
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::usedcnt,
                         (long)iVar2);
      if ((*rVar5._M_p & rVar5._M_mask) == 0) {
        iVar2 = count_rec(iVar2,skip);
        iVar3 = iVar3 + iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int count_rec(int v, int skip) {
    int cnt = 1;
    usedcnt[v] = true;

    for (int to : edge[v]) {
        if(to == skip || usedcnt[to]) 
            continue;

        cnt += count_rec(to, skip);
    }
    
    return cnt;
}